

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O2

void __thiscall
xray_re::xr_spawn_object::xr_spawn_object(xr_spawn_object *this,xr_scene *scene,char *name)

{
  int iVar1;
  cse_abstract *pcVar2;
  
  xr_custom_object::xr_custom_object(&this->super_xr_custom_object,scene,TOOLS_CLASS_SPAWN);
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_spawn_object_0023a0d8;
  this->m_attached_object = (xr_custom_object *)0x0;
  if (name == (char *)0x0) {
    *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = 2;
    (this->field_1).m_entity = (cse_abstract *)0x0;
  }
  else {
    iVar1 = strcmp(name,"$rpoint");
    if (iVar1 == 0) {
      *(undefined4 *)&(this->super_xr_custom_object).field_0x6f = 0;
      *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = 0;
    }
    else {
      iVar1 = strcmp(name,"$env_mod");
      if (iVar1 == 0) {
        *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = 1;
        (this->field_1).m_entity = (cse_abstract *)0x3f80000041200000;
        *(undefined8 *)((long)&this->field_1 + 8) = 0x80808043960000;
        *(undefined8 *)((long)&this->field_1 + 0x10) = 0x3f800000;
        *(undefined8 *)((long)&this->field_1 + 0x18) = 0xffffff00ffffff;
      }
      else {
        *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = 2;
        pcVar2 = create_entity(name);
        (this->field_1).m_entity = pcVar2;
        if (pcVar2 == (cse_abstract *)0x0) {
          __assert_fail("m_entity",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                        ,0x22,"xray_re::xr_spawn_object::xr_spawn_object(xr_scene &, const char *)")
          ;
        }
      }
    }
  }
  return;
}

Assistant:

xr_spawn_object::xr_spawn_object(xr_scene& scene, const char* name):
	xr_custom_object(scene, TOOLS_CLASS_SPAWN), m_attached_object(0)
{
	if (name == 0) {
		m_type = SPAWNPOINT_TYPE_ENTITY;
		m_entity = 0;
	} else if (std::strcmp(name, "$rpoint") == 0) {
		m_type = SPAWNPOINT_TYPE_RPOINT;
		m_team = 0;
		m_respawn = 0;
		m_game = 0;
	} else if (std::strcmp(name, "$env_mod") == 0) {
		m_type = SPAWNPOINT_TYPE_ENV_MOD;
		m_radius = 10.f;
		m_power = 1.f;
		m_view_distance = 300.f;
		m_fog_color = 0x00808080;
		m_fog_density = 1.f;
		m_ambient_color = 0;
		m_sky_color = 0xffffff;
		m_hemi_color = 0xffffff;
	} else {
		m_type = SPAWNPOINT_TYPE_ENTITY;
		m_entity = create_entity(name);
		xr_assert(m_entity);
	}
}